

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShutDownRestartTest.cpp
# Opt level: O0

int ShutDownRestartTest(int argc,char **argv)

{
  EStatusCode EVar1;
  LogConfiguration *pLVar2;
  EncryptionOptions *pEVar3;
  PDFUsedFont *pPVar4;
  PDFPage *pPVar5;
  PDFFormXObject *this;
  ObjectIDType inFormXObjectID;
  ResourcesDictionary *this_00;
  string *inOptionalModifiedFile;
  int extraout_EDX;
  int extraout_EDX_00;
  PageContentContext *pPVar6;
  string *inXObjectName;
  int iVar7;
  PDFCreationSettings *inPDFCreationSettings;
  int in_R9D;
  undefined1 local_20c8 [8];
  string formXObjectName;
  XObjectContentContext *xobjectContentContext;
  ObjectIDType formObjectID;
  PDFFormXObject *local_2078;
  PDFFormXObject *xobjectForm;
  PageContentContext *pageContentContext;
  PDFPage *local_2048;
  PDFPage *page_1;
  string local_2038;
  allocator<char> local_2011;
  string local_2010;
  string local_1ff0;
  allocator<char> local_1fc9;
  string local_1fc8;
  string local_1fa8;
  undefined1 local_1f88 [8];
  PDFWriter pdfWriterB;
  string local_10d0;
  string local_10b0;
  allocator<char> local_1089;
  string local_1088;
  EStatusCode local_1064;
  PageContentContext *pPStack_1060;
  EStatusCode encodingStatus;
  PageContentContext *contentContext;
  string local_1050;
  string local_1030;
  PDFUsedFont *local_1010;
  PDFUsedFont *font;
  PDFPage *local_fe8;
  PDFPage *page;
  EncryptionOptions local_fd8;
  PDFCreationSettings local_f88;
  allocator<char> local_f11;
  string local_f10;
  string local_ef0;
  undefined1 local_ed0 [8];
  PDFWriter pdfWriterA;
  EStatusCode status;
  char **argv_local;
  int argc_local;
  
  PDFWriter::PDFWriter((PDFWriter *)local_ed0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f10,"SimpleContentShutdownRestart.pdf",&local_f11);
  BuildRelativeOutputPath(&local_ef0,argv,&local_f10);
  pLVar2 = LogConfiguration::DefaultLogConfiguration();
  pEVar3 = EncryptionOptions::DefaultEncryptionOptions();
  EncryptionOptions::EncryptionOptions(&local_fd8,pEVar3);
  PDFCreationSettings::PDFCreationSettings(&local_f88,true,true,&local_fd8,false);
  inPDFCreationSettings = &local_f88;
  pdfWriterA._3756_4_ =
       PDFWriter::StartPDF((PDFWriter *)local_ed0,&local_ef0,ePDFVersion13,pLVar2,
                           inPDFCreationSettings);
  iVar7 = (int)inPDFCreationSettings;
  PDFCreationSettings::~PDFCreationSettings(&local_f88);
  EncryptionOptions::~EncryptionOptions(&local_fd8);
  std::__cxx11::string::~string((string *)&local_ef0);
  std::__cxx11::string::~string((string *)&local_f10);
  std::allocator<char>::~allocator(&local_f11);
  if (pdfWriterA._3756_4_ == 0) {
    pPVar5 = (PDFPage *)operator_new(0x2b8);
    PDFPage::PDFPage(pPVar5);
    local_fe8 = pPVar5;
    PDFRectangle::PDFRectangle((PDFRectangle *)&font,0.0,0.0,595.0,842.0);
    PDFPage::SetMediaBox(pPVar5,(PDFRectangle *)&font);
    PDFRectangle::~PDFRectangle((PDFRectangle *)&font);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1050,"fonts/arial.ttf",
               (allocator<char> *)((long)&contentContext + 7));
    BuildRelativeInputPath(&local_1030,argv,&local_1050);
    pPVar4 = PDFWriter::GetFontForFile((PDFWriter *)local_ed0,&local_1030,0);
    std::__cxx11::string::~string((string *)&local_1030);
    std::__cxx11::string::~string((string *)&local_1050);
    std::allocator<char>::~allocator((allocator<char> *)((long)&contentContext + 7));
    local_1010 = pPVar4;
    if (pPVar4 == (PDFUsedFont *)0x0) {
      pdfWriterA.mIsModified = true;
      pdfWriterA._3757_3_ = 0xffffff;
      std::operator<<((ostream *)&std::cout,"Failed to create font object for arial.ttf\n");
      page._4_4_ = 2;
    }
    else {
      pPStack_1060 = PDFWriter::StartPageContentContext((PDFWriter *)local_ed0,local_fe8);
      if (pPStack_1060 == (PageContentContext *)0x0) {
        pdfWriterA.mIsModified = true;
        pdfWriterA._3757_3_ = 0xffffff;
        std::operator<<((ostream *)&std::cout,"failed to create content context for page\n");
        page._4_4_ = 2;
      }
      else {
        AbstractContentContext::q(&pPStack_1060->super_AbstractContentContext);
        AbstractContentContext::k(&pPStack_1060->super_AbstractContentContext,100.0,0.0,0.0,0.0);
        AbstractContentContext::re
                  (&pPStack_1060->super_AbstractContentContext,100.0,500.0,100.0,100.0);
        AbstractContentContext::f(&pPStack_1060->super_AbstractContentContext);
        AbstractContentContext::Q(&pPStack_1060->super_AbstractContentContext);
        pPVar6 = pPStack_1060;
        pdfWriterA._3756_4_ =
             PDFWriter::PausePageContentContext((PDFWriter *)local_ed0,pPStack_1060);
        if (pdfWriterA._3756_4_ == eSuccess) {
          AbstractContentContext::q(&pPStack_1060->super_AbstractContentContext);
          AbstractContentContext::k(&pPStack_1060->super_AbstractContentContext,0.0,100.0,100.0,0.0)
          ;
          AbstractContentContext::re
                    (&pPStack_1060->super_AbstractContentContext,200.0,600.0,200.0,100.0);
          AbstractContentContext::f(&pPStack_1060->super_AbstractContentContext);
          AbstractContentContext::Q(&pPStack_1060->super_AbstractContentContext);
          AbstractContentContext::q(&pPStack_1060->super_AbstractContentContext);
          AbstractContentContext::G(&pPStack_1060->super_AbstractContentContext,0.5);
          AbstractContentContext::w(&pPStack_1060->super_AbstractContentContext,3.0);
          AbstractContentContext::m
                    (&pPStack_1060->super_AbstractContentContext,pPVar6,extraout_EDX,
                     &pLVar2->ShouldLog,iVar7,in_R9D);
          AbstractContentContext::l(&pPStack_1060->super_AbstractContentContext,400.0,400.0);
          AbstractContentContext::S(&pPStack_1060->super_AbstractContentContext);
          AbstractContentContext::Q(&pPStack_1060->super_AbstractContentContext);
          AbstractContentContext::BT(&pPStack_1060->super_AbstractContentContext);
          AbstractContentContext::k(&pPStack_1060->super_AbstractContentContext,0.0,0.0,0.0,1.0);
          AbstractContentContext::Tf(&pPStack_1060->super_AbstractContentContext,local_1010,1.0);
          AbstractContentContext::Tm
                    (&pPStack_1060->super_AbstractContentContext,30.0,0.0,0.0,30.0,78.4252,662.8997)
          ;
          pPVar6 = pPStack_1060;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1088,"hello world",&local_1089);
          EVar1 = AbstractContentContext::Tj(&pPVar6->super_AbstractContentContext,&local_1088);
          std::__cxx11::string::~string((string *)&local_1088);
          std::allocator<char>::~allocator(&local_1089);
          local_1064 = EVar1;
          if (EVar1 != eSuccess) {
            std::operator<<((ostream *)&std::cout,"Could not find some of the glyphs for this font")
            ;
          }
          AbstractContentContext::ET(&pPStack_1060->super_AbstractContentContext);
          pdfWriterA._3756_4_ =
               PDFWriter::EndPageContentContext((PDFWriter *)local_ed0,pPStack_1060);
          if (pdfWriterA._3756_4_ == eSuccess) {
            pdfWriterA._3756_4_ = PDFWriter::WritePageAndRelease((PDFWriter *)local_ed0,local_fe8);
            if (pdfWriterA._3756_4_ == eSuccess) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_10d0,"ShutDownRestartState.txt",
                         (allocator<char> *)&pdfWriterB.field_0xeaf);
              BuildRelativeOutputPath(&local_10b0,argv,&local_10d0);
              pdfWriterA._3756_4_ = PDFWriter::Shutdown((PDFWriter *)local_ed0,&local_10b0);
              std::__cxx11::string::~string((string *)&local_10b0);
              std::__cxx11::string::~string((string *)&local_10d0);
              std::allocator<char>::~allocator((allocator<char> *)&pdfWriterB.field_0xeaf);
              if (pdfWriterA._3756_4_ == 0) {
                page._4_4_ = 0;
              }
              else {
                std::operator<<((ostream *)&std::cout,"failed to shutdown library\n");
                page._4_4_ = 2;
              }
            }
            else {
              std::operator<<((ostream *)&std::cout,"failed to write page\n");
              page._4_4_ = 2;
            }
          }
          else {
            std::operator<<((ostream *)&std::cout,"failed to end page content context\n");
            page._4_4_ = 2;
          }
        }
        else {
          std::operator<<((ostream *)&std::cout,"failed to pause page content context\n");
          page._4_4_ = 2;
        }
      }
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"failed to start PDF\n");
    page._4_4_ = 2;
  }
  PDFWriter::~PDFWriter((PDFWriter *)local_ed0);
  if (page._4_4_ == 0) {
    PDFWriter::PDFWriter((PDFWriter *)local_1f88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1fc8,"SimpleContentShutdownRestart.pdf",&local_1fc9);
    BuildRelativeOutputPath(&local_1fa8,argv,&local_1fc8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2010,"ShutDownRestartState.txt",&local_2011);
    BuildRelativeOutputPath(&local_1ff0,argv,&local_2010);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2038,"",(allocator<char> *)((long)&page_1 + 7));
    pLVar2 = LogConfiguration::DefaultLogConfiguration();
    inOptionalModifiedFile = &local_2038;
    pdfWriterA._3756_4_ =
         PDFWriter::ContinuePDF
                   ((PDFWriter *)local_1f88,&local_1fa8,&local_1ff0,inOptionalModifiedFile,pLVar2);
    iVar7 = (int)pLVar2;
    std::__cxx11::string::~string((string *)&local_2038);
    std::allocator<char>::~allocator((allocator<char> *)((long)&page_1 + 7));
    std::__cxx11::string::~string((string *)&local_1ff0);
    std::__cxx11::string::~string((string *)&local_2010);
    std::allocator<char>::~allocator(&local_2011);
    std::__cxx11::string::~string((string *)&local_1fa8);
    std::__cxx11::string::~string((string *)&local_1fc8);
    std::allocator<char>::~allocator(&local_1fc9);
    if (pdfWriterA._3756_4_ == 0) {
      pPVar5 = (PDFPage *)operator_new(0x2b8);
      PDFPage::PDFPage(pPVar5);
      local_2048 = pPVar5;
      PDFRectangle::PDFRectangle((PDFRectangle *)&pageContentContext,0.0,0.0,595.0,842.0);
      PDFPage::SetMediaBox(pPVar5,(PDFRectangle *)&pageContentContext);
      PDFRectangle::~PDFRectangle((PDFRectangle *)&pageContentContext);
      xobjectForm = (PDFFormXObject *)
                    PDFWriter::StartPageContentContext((PDFWriter *)local_1f88,local_2048);
      if (xobjectForm == (PDFFormXObject *)0x0) {
        pdfWriterA.mIsModified = true;
        pdfWriterA._3757_3_ = 0xffffff;
        std::operator<<((ostream *)&std::cout,"failed to create content context for page\n");
      }
      AbstractContentContext::q((AbstractContentContext *)xobjectForm);
      AbstractContentContext::k((AbstractContentContext *)xobjectForm,100.0,0.0,0.0,0.0);
      AbstractContentContext::re((AbstractContentContext *)xobjectForm,100.0,500.0,100.0,100.0);
      AbstractContentContext::f((AbstractContentContext *)xobjectForm);
      AbstractContentContext::Q((AbstractContentContext *)xobjectForm);
      pdfWriterA._3756_4_ =
           PDFWriter::PausePageContentContext
                     ((PDFWriter *)local_1f88,(PageContentContext *)xobjectForm);
      if (pdfWriterA._3756_4_ == eSuccess) {
        PDFRectangle::PDFRectangle((PDFRectangle *)&formObjectID,0.0,0.0,200.0,100.0);
        this = PDFWriter::StartFormXObject
                         ((PDFWriter *)local_1f88,(PDFRectangle *)&formObjectID,(double *)0x0);
        PDFRectangle::~PDFRectangle((PDFRectangle *)&formObjectID);
        local_2078 = this;
        if (this == (PDFFormXObject *)0x0) {
          pdfWriterA.mIsModified = true;
          pdfWriterA._3757_3_ = 0xffffff;
          std::operator<<((ostream *)&std::cout,"failed to create form xobject\n");
          page._4_4_ = 2;
        }
        else {
          inFormXObjectID = PDFFormXObject::GetObjectID(this);
          formXObjectName.field_2._8_8_ = PDFFormXObject::GetContentContext(local_2078);
          AbstractContentContext::q((AbstractContentContext *)formXObjectName.field_2._8_8_);
          AbstractContentContext::k
                    ((AbstractContentContext *)formXObjectName.field_2._8_8_,0.0,100.0,100.0,0.0);
          AbstractContentContext::re
                    ((AbstractContentContext *)formXObjectName.field_2._8_8_,0.0,0.0,200.0,100.0);
          AbstractContentContext::f((AbstractContentContext *)formXObjectName.field_2._8_8_);
          AbstractContentContext::Q((AbstractContentContext *)formXObjectName.field_2._8_8_);
          pdfWriterA._3756_4_ =
               PDFWriter::EndFormXObjectAndRelease((PDFWriter *)local_1f88,local_2078);
          if (pdfWriterA._3756_4_ == eSuccess) {
            this_00 = PDFPage::GetResourcesDictionary(local_2048);
            ResourcesDictionary::AddFormXObjectMapping_abi_cxx11_
                      ((string *)local_20c8,this_00,inFormXObjectID);
            AbstractContentContext::q((AbstractContentContext *)xobjectForm);
            AbstractContentContext::cm
                      ((AbstractContentContext *)xobjectForm,1.0,0.0,0.0,1.0,200.0,600.0);
            inXObjectName = (string *)local_20c8;
            AbstractContentContext::Do((AbstractContentContext *)xobjectForm,inXObjectName);
            AbstractContentContext::Q((AbstractContentContext *)xobjectForm);
            AbstractContentContext::q((AbstractContentContext *)xobjectForm);
            AbstractContentContext::G((AbstractContentContext *)xobjectForm,0.5);
            AbstractContentContext::w((AbstractContentContext *)xobjectForm,3.0);
            AbstractContentContext::m
                      ((AbstractContentContext *)xobjectForm,inXObjectName,extraout_EDX_00,
                       (char *)inOptionalModifiedFile,iVar7,in_R9D);
            AbstractContentContext::l((AbstractContentContext *)xobjectForm,400.0,400.0);
            AbstractContentContext::S((AbstractContentContext *)xobjectForm);
            AbstractContentContext::Q((AbstractContentContext *)xobjectForm);
            AbstractContentContext::q((AbstractContentContext *)xobjectForm);
            AbstractContentContext::cm
                      ((AbstractContentContext *)xobjectForm,1.0,0.0,0.0,1.0,200.0,200.0);
            AbstractContentContext::Do((AbstractContentContext *)xobjectForm,(string *)local_20c8);
            AbstractContentContext::Q((AbstractContentContext *)xobjectForm);
            pdfWriterA._3756_4_ =
                 PDFWriter::EndPageContentContext
                           ((PDFWriter *)local_1f88,(PageContentContext *)xobjectForm);
            if (pdfWriterA._3756_4_ == eSuccess) {
              pdfWriterA._3756_4_ =
                   PDFWriter::WritePageAndRelease((PDFWriter *)local_1f88,local_2048);
              if (pdfWriterA._3756_4_ == eSuccess) {
                pdfWriterA._3756_4_ = PDFWriter::EndPDF((PDFWriter *)local_1f88);
                if (pdfWriterA._3756_4_ == eSuccess) {
                  page._4_4_ = 0;
                }
                else {
                  std::operator<<((ostream *)&std::cout,"failed in end PDF\n");
                  page._4_4_ = 2;
                }
              }
              else {
                std::operator<<((ostream *)&std::cout,"failed to write page\n");
                page._4_4_ = 2;
              }
            }
            else {
              std::operator<<((ostream *)&std::cout,"failed to end page content context\n");
              page._4_4_ = 2;
            }
            std::__cxx11::string::~string((string *)local_20c8);
          }
          else {
            std::operator<<((ostream *)&std::cout,"failed to write XObject form\n");
            page._4_4_ = 2;
          }
        }
      }
      else {
        std::operator<<((ostream *)&std::cout,"failed to pause page content context\n");
        page._4_4_ = 2;
      }
    }
    else {
      std::operator<<((ostream *)&std::cout,"failed to restart library\n");
      page._4_4_ = 2;
    }
    PDFWriter::~PDFWriter((PDFWriter *)local_1f88);
  }
  return (uint)(pdfWriterA._3756_4_ != 0);
}

Assistant:

int ShutDownRestartTest(int argc, char* argv[])
{
	EStatusCode status; 

	do
	{
		{
			PDFWriter pdfWriterA;
			status = pdfWriterA.StartPDF(BuildRelativeOutputPath(argv,"SimpleContentShutdownRestart.pdf"),ePDFVersion13);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to start PDF\n";
				break;
			}	

			PDFPage* page = new PDFPage();
			page->SetMediaBox(PDFRectangle(0,0,595,842));

			PDFUsedFont* font = pdfWriterA.GetFontForFile(BuildRelativeInputPath(argv,"fonts/arial.ttf"));
			if(!font)
			{
				status = PDFHummus::eFailure;
				cout<<"Failed to create font object for arial.ttf\n";
				break;
			}

			PageContentContext* contentContext = pdfWriterA.StartPageContentContext(page);
			if(NULL == contentContext)
			{
				status = PDFHummus::eFailure;
				cout<<"failed to create content context for page\n";
				break;
			}

			// draw a 100X100 points cyan square
			contentContext->q();
			contentContext->k(100,0,0,0);
			contentContext->re(100,500,100,100);
			contentContext->f();
			contentContext->Q();

			// force stream change
			status = pdfWriterA.PausePageContentContext(contentContext);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to pause page content context\n";
				break;
			}

			// draw a 200X100 points red rectangle
			contentContext->q();
			contentContext->k(0,100,100,0);
			contentContext->re(200,600,200,100);
			contentContext->f();
			contentContext->Q();

			// draw a gray line
			contentContext->q();
			contentContext->G(0.5);
			contentContext->w(3);
			contentContext->m(200,600);
			contentContext->l(400,400);
			contentContext->S();
			contentContext->Q();

			// Draw some text
			contentContext->BT();
			contentContext->k(0,0,0,1);
			contentContext->Tf(font,1);
			contentContext->Tm(30,0,0,30,78.4252,662.8997);

			EStatusCode encodingStatus = contentContext->Tj("hello world");
			if(encodingStatus != PDFHummus::eSuccess)
				cout<<"Could not find some of the glyphs for this font";

			// continue even if failed...want to see how it looks like
			contentContext->ET();
				
			status = pdfWriterA.EndPageContentContext(contentContext);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to end page content context\n";
				break;
			}

			status = pdfWriterA.WritePageAndRelease(page);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to write page\n";
				break;
			}


			status = pdfWriterA.Shutdown(BuildRelativeOutputPath(argv,"ShutDownRestartState.txt"));
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to shutdown library\n";
				break;
			}

		}
		{
			PDFWriter pdfWriterB;
			status = pdfWriterB.ContinuePDF(
                            BuildRelativeOutputPath(argv,"SimpleContentShutdownRestart.pdf"),
                            BuildRelativeOutputPath(argv,"ShutDownRestartState.txt")
                    );
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to restart library\n";
				break;
			}	

			PDFPage* page = new PDFPage();
			page->SetMediaBox(PDFRectangle(0,0,595,842));

			PageContentContext* pageContentContext = pdfWriterB.StartPageContentContext(page);
			if(NULL == pageContentContext)
			{
				status = PDFHummus::eFailure;
				cout<<"failed to create content context for page\n";
			}

			// draw a 100X100 points cyan square
			pageContentContext->q();
			pageContentContext->k(100,0,0,0);
			pageContentContext->re(100,500,100,100);
			pageContentContext->f();
			pageContentContext->Q();

			// pause stream to start writing a form xobject
			status = pdfWriterB.PausePageContentContext(pageContentContext);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to pause page content context\n";
				break;
			}

			// define an xobject form to draw a 200X100 points red rectangle
			PDFFormXObject* xobjectForm = pdfWriterB.StartFormXObject(PDFRectangle(0,0,200,100));
			if(!xobjectForm)
			{
				status = PDFHummus::eFailure;
				cout<<"failed to create form xobject\n";
				break;
			}
			ObjectIDType formObjectID = xobjectForm->GetObjectID();

			XObjectContentContext* xobjectContentContext = xobjectForm->GetContentContext();
			xobjectContentContext->q();
			xobjectContentContext->k(0,100,100,0);
			xobjectContentContext->re(0,0,200,100);
			xobjectContentContext->f();
			xobjectContentContext->Q();

			status = pdfWriterB.EndFormXObjectAndRelease(xobjectForm);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to write XObject form\n";
				break;
			}

			string formXObjectName = page->GetResourcesDictionary().AddFormXObjectMapping(formObjectID);

			// continue page drawing, place the form in 200,600
			pageContentContext->q();
			pageContentContext->cm(1,0,0,1,200,600);
			pageContentContext->Do(formXObjectName);
			pageContentContext->Q();

			// draw a gray line
			pageContentContext->q();
			pageContentContext->G(0.5);
			pageContentContext->w(3);
			pageContentContext->m(200,600);
			pageContentContext->l(400,400);
			pageContentContext->S();
			pageContentContext->Q();

			// place the form in another location
			pageContentContext->q();
			pageContentContext->cm(1,0,0,1,200,200);
			pageContentContext->Do(formXObjectName);
			pageContentContext->Q();

			status = pdfWriterB.EndPageContentContext(pageContentContext);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to end page content context\n";
				break;
			}

			status = pdfWriterB.WritePageAndRelease(page);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to write page\n";
				break;
			}

			status = pdfWriterB.EndPDF();
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed in end PDF\n";
				break;
			}
		}
	}while(false);
	return status == eSuccess ? 0:1;

}